

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hh
# Opt level: O2

void __thiscall xt::_Vector::_Vector(_Vector *this,uint cnt,uint shift,Node *root,ObjectArray *tail)

{
  this->cnt = cnt;
  this->shift = shift;
  std::__shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->root).super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>,
             &root->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>);
  std::
  __shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->tail).
                super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
               ,&tail->
                 super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
              );
  return;
}

Assistant:

_Vector(unsigned int cnt, unsigned int shift, Node root, ObjectArray tail) : cnt(cnt), shift(shift), root(root), tail(tail) {}